

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vsum.cc
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  bool bVar2;
  byte bVar3;
  undefined1 uVar4;
  ostream *poVar5;
  int *actual_read_size;
  long in_RSI;
  int in_EDI;
  ostringstream error_message_12;
  ostringstream error_message_11;
  ostringstream error_message_10;
  int num_data;
  ostringstream error_message_9;
  ostringstream error_message_8;
  ostringstream error_message_7;
  int vector_index;
  vector<double,_std::allocator<double>_> sum;
  vector<double,_std::allocator<double>_> data;
  ostringstream error_message_6;
  Buffer buffer;
  StatisticsAccumulation accumulation;
  istream *input_stream;
  ostringstream error_message_5;
  ifstream ifs;
  ostringstream error_message_4;
  char *input_file;
  ostringstream error_message_3;
  int num_input_files;
  ostringstream error_message_2;
  ostringstream error_message_1;
  ostringstream error_message;
  int option_char;
  bool cumulative_mode_flag;
  int output_interval;
  int vector_length;
  option *in_stack_ffffffffffffe5c8;
  Buffer *buffer_00;
  Buffer *in_stack_ffffffffffffe5d0;
  undefined7 in_stack_ffffffffffffe5d8;
  undefined1 in_stack_ffffffffffffe5df;
  Buffer *in_stack_ffffffffffffe5e0;
  undefined7 in_stack_ffffffffffffe5e8;
  undefined1 in_stack_ffffffffffffe5ef;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffe5f0;
  allocator *paVar6;
  ostream *in_stack_ffffffffffffe600;
  undefined7 in_stack_ffffffffffffe608;
  undefined1 in_stack_ffffffffffffe60f;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffe610;
  int in_stack_ffffffffffffe618;
  int in_stack_ffffffffffffe61c;
  Buffer *in_stack_ffffffffffffe620;
  undefined6 in_stack_ffffffffffffe628;
  undefined1 in_stack_ffffffffffffe62e;
  char *local_19a0;
  char *local_1958;
  bool local_192a;
  bool local_18fa;
  undefined5 in_stack_ffffffffffffe728;
  byte in_stack_ffffffffffffe72d;
  undefined1 in_stack_ffffffffffffe72e;
  undefined1 in_stack_ffffffffffffe72f;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffe730;
  StatisticsAccumulation *in_stack_ffffffffffffe738;
  allocator<char> local_18b1;
  string local_18b0 [32];
  ostringstream local_1890 [72];
  ostringstream *in_stack_ffffffffffffe7b8;
  string *in_stack_ffffffffffffe7c0;
  undefined1 local_1711 [33];
  ostringstream local_16f0 [383];
  allocator local_1571;
  string local_1570 [32];
  ostringstream local_1550 [376];
  int local_13d8;
  allocator local_13d1;
  string local_13d0 [32];
  ostringstream local_13b0 [383];
  allocator local_1231;
  string local_1230 [32];
  ostringstream local_1210 [383];
  allocator local_1091;
  string local_1090 [32];
  ostringstream local_1070 [376];
  int local_ef8;
  allocator local_eb1;
  string local_eb0 [32];
  ostringstream local_e90 [376];
  Buffer local_d18;
  StatisticsAccumulation local_c98;
  char *local_c80;
  undefined4 local_c78;
  allocator local_c71;
  string local_c70 [32];
  ostringstream local_c50 [376];
  char local_ad8 [527];
  allocator local_8c9;
  string local_8c8 [32];
  ostringstream local_8a8 [376];
  char *local_730;
  allocator local_721;
  string local_720 [32];
  ostringstream local_700 [376];
  int local_588;
  allocator local_581;
  string local_580 [32];
  ostringstream local_560 [383];
  allocator local_3e1;
  string local_3e0 [39];
  allocator local_3b9;
  string local_3b8 [32];
  ostringstream local_398 [383];
  allocator local_219;
  string local_218 [39];
  allocator local_1f1;
  string local_1f0 [32];
  ostringstream local_1d0 [399];
  undefined1 local_41 [33];
  int local_20;
  byte local_19;
  int local_18;
  int local_14;
  long local_10;
  int local_8;
  int local_4;
  
  local_4 = 0;
  local_14 = 1;
  local_18 = -1;
  local_19 = 0;
  local_10 = in_RSI;
  local_8 = in_EDI;
  while (local_20 = ya_getopt_long((int)((ulong)in_stack_ffffffffffffe5e0 >> 0x20),
                                   (char **)CONCAT17(in_stack_ffffffffffffe5df,
                                                     in_stack_ffffffffffffe5d8),
                                   (char *)in_stack_ffffffffffffe5d0,in_stack_ffffffffffffe5c8,
                                   (int *)0x103712), pcVar1 = ya_optarg, local_20 != -1) {
    switch(local_20) {
    case 99:
      local_19 = 1;
      break;
    default:
      anon_unknown.dwarf_18ff::PrintUsage(in_stack_ffffffffffffe600);
      return 1;
    case 0x68:
      anon_unknown.dwarf_18ff::PrintUsage(in_stack_ffffffffffffe600);
      return 0;
    case 0x6c:
      in_stack_ffffffffffffe738 = (StatisticsAccumulation *)local_41;
      in_stack_ffffffffffffe730 = (vector<double,_std::allocator<double>_> *)ya_optarg;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)(local_41 + 1),(char *)in_stack_ffffffffffffe730,
                 (allocator *)in_stack_ffffffffffffe738);
      in_stack_ffffffffffffe72f =
           sptk::ConvertStringToInteger
                     ((string *)CONCAT17(in_stack_ffffffffffffe5df,in_stack_ffffffffffffe5d8),
                      (int *)in_stack_ffffffffffffe5d0);
      in_stack_ffffffffffffe72d = !(bool)in_stack_ffffffffffffe72f || local_14 < 1;
      in_stack_ffffffffffffe72e = in_stack_ffffffffffffe72d;
      std::__cxx11::string::~string((string *)(local_41 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_41);
      if ((in_stack_ffffffffffffe72d & 1) != 0) {
        std::__cxx11::ostringstream::ostringstream(local_1d0);
        std::operator<<((ostream *)local_1d0,
                        "The argument for the -l option must be a positive integer");
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_1f0,"vsum",&local_1f1);
        sptk::PrintErrorMessage(in_stack_ffffffffffffe7c0,in_stack_ffffffffffffe7b8);
        std::__cxx11::string::~string(local_1f0);
        std::allocator<char>::~allocator((allocator<char> *)&local_1f1);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_1d0);
        return local_4;
      }
      break;
    case 0x6d:
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_218,pcVar1,&local_219);
      bVar2 = sptk::ConvertStringToInteger
                        ((string *)CONCAT17(in_stack_ffffffffffffe5df,in_stack_ffffffffffffe5d8),
                         (int *)in_stack_ffffffffffffe5d0);
      local_18fa = !bVar2 || local_14 < 0;
      std::__cxx11::string::~string(local_218);
      std::allocator<char>::~allocator((allocator<char> *)&local_219);
      if (local_18fa) {
        std::__cxx11::ostringstream::ostringstream(local_398);
        poVar5 = std::operator<<((ostream *)local_398,"The argument for the -m option must be a ");
        std::operator<<(poVar5,"non-negative integer");
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_3b8,"vsum",&local_3b9);
        sptk::PrintErrorMessage(in_stack_ffffffffffffe7c0,in_stack_ffffffffffffe7b8);
        std::__cxx11::string::~string(local_3b8);
        std::allocator<char>::~allocator((allocator<char> *)&local_3b9);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_398);
        return local_4;
      }
      local_14 = local_14 + 1;
      break;
    case 0x74:
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_3e0,pcVar1,&local_3e1);
      bVar2 = sptk::ConvertStringToInteger
                        ((string *)CONCAT17(in_stack_ffffffffffffe5df,in_stack_ffffffffffffe5d8),
                         (int *)in_stack_ffffffffffffe5d0);
      local_192a = !bVar2 || local_18 < 1;
      std::__cxx11::string::~string(local_3e0);
      std::allocator<char>::~allocator((allocator<char> *)&local_3e1);
      if (local_192a) {
        std::__cxx11::ostringstream::ostringstream(local_560);
        std::operator<<((ostream *)local_560,
                        "The argument for the -t option must be a positive integer");
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_580,"vsum",&local_581);
        sptk::PrintErrorMessage(in_stack_ffffffffffffe7c0,in_stack_ffffffffffffe7b8);
        std::__cxx11::string::~string(local_580);
        std::allocator<char>::~allocator((allocator<char> *)&local_581);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_560);
        return local_4;
      }
    }
  }
  local_588 = local_8 - ya_optind;
  if (1 < local_588) {
    std::__cxx11::ostringstream::ostringstream(local_700);
    std::operator<<((ostream *)local_700,"Too many input files");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_720,"vsum",&local_721);
    sptk::PrintErrorMessage(in_stack_ffffffffffffe7c0,in_stack_ffffffffffffe7b8);
    std::__cxx11::string::~string(local_720);
    std::allocator<char>::~allocator((allocator<char> *)&local_721);
    local_4 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_700);
    return local_4;
  }
  if (local_588 == 0) {
    local_1958 = (char *)0x0;
  }
  else {
    local_1958 = *(char **)(local_10 + (long)ya_optind * 8);
  }
  local_730 = local_1958;
  bVar2 = sptk::SetBinaryMode();
  if (!bVar2) {
    std::__cxx11::ostringstream::ostringstream(local_8a8);
    std::operator<<((ostream *)local_8a8,"Cannot set translation mode");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_8c8,"vsum",&local_8c9);
    sptk::PrintErrorMessage(in_stack_ffffffffffffe7c0,in_stack_ffffffffffffe7b8);
    std::__cxx11::string::~string(local_8c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_8c9);
    local_4 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_8a8);
    return local_4;
  }
  std::ifstream::ifstream(local_ad8);
  pcVar1 = local_730;
  if (local_730 != (char *)0x0) {
    std::operator|(_S_in,_S_bin);
    std::ifstream::open(local_ad8,(_Ios_Openmode)pcVar1);
    bVar3 = std::ios::fail();
    if ((bVar3 & 1) != 0) {
      std::__cxx11::ostringstream::ostringstream(local_c50);
      poVar5 = std::operator<<((ostream *)local_c50,"Cannot open file ");
      std::operator<<(poVar5,local_730);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_c70,"vsum",&local_c71);
      sptk::PrintErrorMessage(in_stack_ffffffffffffe7c0,in_stack_ffffffffffffe7b8);
      std::__cxx11::string::~string(local_c70);
      std::allocator<char>::~allocator((allocator<char> *)&local_c71);
      local_4 = 1;
      local_c78 = 1;
      std::__cxx11::ostringstream::~ostringstream(local_c50);
      goto LAB_00104eed;
    }
  }
  bVar3 = std::ifstream::is_open();
  if ((bVar3 & 1) == 0) {
    local_19a0 = (char *)&std::cin;
  }
  else {
    local_19a0 = local_ad8;
  }
  local_c80 = local_19a0;
  sptk::StatisticsAccumulation::StatisticsAccumulation(&local_c98,local_14 + -1,1,false,false);
  sptk::StatisticsAccumulation::Buffer::Buffer(in_stack_ffffffffffffe5e0);
  bVar2 = sptk::StatisticsAccumulation::IsValid(&local_c98);
  if (bVar2) {
    std::allocator<double>::allocator((allocator<double> *)0x10450c);
    std::vector<double,_std::allocator<double>_>::vector
              (in_stack_ffffffffffffe5f0,
               CONCAT17(in_stack_ffffffffffffe5ef,in_stack_ffffffffffffe5e8),
               (allocator_type *)in_stack_ffffffffffffe5e0);
    std::allocator<double>::~allocator((allocator<double> *)0x104535);
    actual_read_size = (int *)(long)local_14;
    std::allocator<double>::allocator((allocator<double> *)0x104554);
    std::vector<double,_std::allocator<double>_>::vector
              (in_stack_ffffffffffffe5f0,
               CONCAT17(in_stack_ffffffffffffe5ef,in_stack_ffffffffffffe5e8),
               (allocator_type *)in_stack_ffffffffffffe5e0);
    std::allocator<double>::~allocator((allocator<double> *)0x10457a);
    local_ef8 = 1;
    while( true ) {
      buffer_00 = (Buffer *)0x0;
      uVar4 = sptk::ReadStream<double>
                        (SUB81((ulong)in_stack_ffffffffffffe620 >> 0x30,0),
                         (int)in_stack_ffffffffffffe620,in_stack_ffffffffffffe61c,
                         in_stack_ffffffffffffe618,in_stack_ffffffffffffe610,
                         (istream *)CONCAT17(in_stack_ffffffffffffe60f,in_stack_ffffffffffffe608),
                         actual_read_size);
      if (!(bool)uVar4) break;
      in_stack_ffffffffffffe62e =
           sptk::StatisticsAccumulation::Run
                     (in_stack_ffffffffffffe738,in_stack_ffffffffffffe730,
                      (Buffer *)
                      CONCAT17(in_stack_ffffffffffffe72f,
                               CONCAT16(in_stack_ffffffffffffe72e,
                                        CONCAT15(in_stack_ffffffffffffe72d,in_stack_ffffffffffffe728
                                                ))));
      if (!(bool)in_stack_ffffffffffffe62e) {
        std::__cxx11::ostringstream::ostringstream(local_1070);
        std::operator<<((ostream *)local_1070,"Failed to accumulate statistics");
        paVar6 = &local_1091;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_1090,"vsum",paVar6);
        sptk::PrintErrorMessage(in_stack_ffffffffffffe7c0,in_stack_ffffffffffffe7b8);
        std::__cxx11::string::~string(local_1090);
        std::allocator<char>::~allocator((allocator<char> *)&local_1091);
        local_4 = 1;
        local_c78 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_1070);
        goto LAB_00104e7d;
      }
      if ((local_18 != -1) && (local_ef8 % local_18 == 0)) {
        bVar2 = sptk::StatisticsAccumulation::GetSum
                          ((StatisticsAccumulation *)
                           CONCAT17(uVar4,CONCAT16(in_stack_ffffffffffffe62e,
                                                   in_stack_ffffffffffffe628)),
                           in_stack_ffffffffffffe620,
                           (vector<double,_std::allocator<double>_> *)
                           CONCAT44(in_stack_ffffffffffffe61c,in_stack_ffffffffffffe618));
        in_stack_ffffffffffffe61c = CONCAT13(bVar2,(int3)in_stack_ffffffffffffe61c);
        if (!bVar2) {
          std::__cxx11::ostringstream::ostringstream(local_1210);
          std::operator<<((ostream *)local_1210,"Failed to accumulate statistics");
          paVar6 = &local_1231;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_1230,"vsum",paVar6);
          sptk::PrintErrorMessage(in_stack_ffffffffffffe7c0,in_stack_ffffffffffffe7b8);
          std::__cxx11::string::~string(local_1230);
          std::allocator<char>::~allocator((allocator<char> *)&local_1231);
          local_4 = 1;
          local_c78 = 1;
          std::__cxx11::ostringstream::~ostringstream(local_1210);
          goto LAB_00104e7d;
        }
        in_stack_ffffffffffffe60f =
             sptk::WriteStream<double>
                       ((int)in_stack_ffffffffffffe620,in_stack_ffffffffffffe61c,
                        in_stack_ffffffffffffe610,
                        (ostream *)CONCAT17(in_stack_ffffffffffffe60f,in_stack_ffffffffffffe608),
                        (int *)in_stack_ffffffffffffe600);
        if (!(bool)in_stack_ffffffffffffe60f) {
          std::__cxx11::ostringstream::ostringstream(local_13b0);
          std::operator<<((ostream *)local_13b0,"Failed to write statistics");
          paVar6 = &local_13d1;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_13d0,"vsum",paVar6);
          sptk::PrintErrorMessage(in_stack_ffffffffffffe7c0,in_stack_ffffffffffffe7b8);
          std::__cxx11::string::~string(local_13d0);
          std::allocator<char>::~allocator((allocator<char> *)&local_13d1);
          local_4 = 1;
          local_c78 = 1;
          std::__cxx11::ostringstream::~ostringstream(local_13b0);
          goto LAB_00104e7d;
        }
        if ((local_19 & 1) == 0) {
          sptk::StatisticsAccumulation::Clear
                    ((StatisticsAccumulation *)in_stack_ffffffffffffe5d0,buffer_00);
        }
      }
      local_ef8 = local_ef8 + 1;
    }
    bVar2 = sptk::StatisticsAccumulation::GetNumData(&local_c98,&local_d18,&local_13d8);
    if (bVar2) {
      if ((local_18 == -1) && (0 < local_13d8)) {
        bVar2 = sptk::StatisticsAccumulation::GetSum
                          ((StatisticsAccumulation *)
                           CONCAT17(uVar4,CONCAT16(in_stack_ffffffffffffe62e,
                                                   in_stack_ffffffffffffe628)),
                           in_stack_ffffffffffffe620,
                           (vector<double,_std::allocator<double>_> *)
                           CONCAT44(in_stack_ffffffffffffe61c,in_stack_ffffffffffffe618));
        if (bVar2) {
          bVar2 = sptk::WriteStream<double>
                            ((int)in_stack_ffffffffffffe620,in_stack_ffffffffffffe61c,
                             in_stack_ffffffffffffe610,
                             (ostream *)
                             CONCAT17(in_stack_ffffffffffffe60f,in_stack_ffffffffffffe608),
                             (int *)in_stack_ffffffffffffe600);
          if (bVar2) goto LAB_00104e67;
          std::__cxx11::ostringstream::ostringstream(local_1890);
          std::operator<<((ostream *)local_1890,"Failed to write summation");
          in_stack_ffffffffffffe5d0 = (Buffer *)&local_18b1;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_18b0,"vsum",(allocator *)in_stack_ffffffffffffe5d0);
          sptk::PrintErrorMessage(in_stack_ffffffffffffe7c0,in_stack_ffffffffffffe7b8);
          std::__cxx11::string::~string(local_18b0);
          std::allocator<char>::~allocator(&local_18b1);
          local_4 = 1;
          local_c78 = 1;
          std::__cxx11::ostringstream::~ostringstream(local_1890);
        }
        else {
          std::__cxx11::ostringstream::ostringstream(local_16f0);
          std::operator<<((ostream *)local_16f0,"Failed to compute summation");
          in_stack_ffffffffffffe5e0 = (Buffer *)local_1711;
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)(local_1711 + 1),"vsum",(allocator *)in_stack_ffffffffffffe5e0);
          sptk::PrintErrorMessage(in_stack_ffffffffffffe7c0,in_stack_ffffffffffffe7b8);
          std::__cxx11::string::~string((string *)(local_1711 + 1));
          std::allocator<char>::~allocator((allocator<char> *)local_1711);
          local_4 = 1;
          local_c78 = 1;
          std::__cxx11::ostringstream::~ostringstream(local_16f0);
        }
      }
      else {
LAB_00104e67:
        local_4 = 0;
        local_c78 = 1;
      }
    }
    else {
      std::__cxx11::ostringstream::ostringstream(local_1550);
      std::operator<<((ostream *)local_1550,"Failed to accumulate statistics");
      paVar6 = &local_1571;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1570,"vsum",paVar6);
      sptk::PrintErrorMessage(in_stack_ffffffffffffe7c0,in_stack_ffffffffffffe7b8);
      std::__cxx11::string::~string(local_1570);
      std::allocator<char>::~allocator((allocator<char> *)&local_1571);
      local_4 = 1;
      local_c78 = 1;
      std::__cxx11::ostringstream::~ostringstream(local_1550);
    }
LAB_00104e7d:
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffe5e0);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffe5e0);
  }
  else {
    std::__cxx11::ostringstream::ostringstream(local_e90);
    std::operator<<((ostream *)local_e90,"Failed to initialize StatisticsAccumulation");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_eb0,"vsum",&local_eb1);
    sptk::PrintErrorMessage(in_stack_ffffffffffffe7c0,in_stack_ffffffffffffe7b8);
    std::__cxx11::string::~string(local_eb0);
    std::allocator<char>::~allocator((allocator<char> *)&local_eb1);
    local_4 = 1;
    local_c78 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_e90);
  }
  sptk::StatisticsAccumulation::Buffer::~Buffer(in_stack_ffffffffffffe5d0);
  sptk::StatisticsAccumulation::~StatisticsAccumulation(&local_c98);
LAB_00104eed:
  std::ifstream::~ifstream(local_ad8);
  return local_4;
}

Assistant:

int main(int argc, char* argv[]) {
  int vector_length(kDefaultVectorLength);
  int output_interval(kMagicNumberForEndOfFile);
  bool cumulative_mode_flag(kDefaultCumulativeModeFlag);

  for (;;) {
    const int option_char(getopt_long(argc, argv, "l:m:t:ch", NULL, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 'l': {
        if (!sptk::ConvertStringToInteger(optarg, &vector_length) ||
            vector_length <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -l option must be a positive integer";
          sptk::PrintErrorMessage("vsum", error_message);
          return 1;
        }
        break;
      }
      case 'm': {
        if (!sptk::ConvertStringToInteger(optarg, &vector_length) ||
            vector_length < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -m option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("vsum", error_message);
          return 1;
        }
        ++vector_length;
        break;
      }
      case 't': {
        if (!sptk::ConvertStringToInteger(optarg, &output_interval) ||
            output_interval <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -t option must be a positive integer";
          sptk::PrintErrorMessage("vsum", error_message);
          return 1;
        }
        break;
      }
      case 'c': {
        cumulative_mode_flag = true;
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  const int num_input_files(argc - optind);
  if (1 < num_input_files) {
    std::ostringstream error_message;
    error_message << "Too many input files";
    sptk::PrintErrorMessage("vsum", error_message);
    return 1;
  }
  const char* input_file(0 == num_input_files ? NULL : argv[optind]);

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("vsum", error_message);
    return 1;
  }

  std::ifstream ifs;
  if (NULL != input_file) {
    ifs.open(input_file, std::ios::in | std::ios::binary);
    if (ifs.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << input_file;
      sptk::PrintErrorMessage("vsum", error_message);
      return 1;
    }
  }
  std::istream& input_stream(ifs.is_open() ? ifs : std::cin);

  sptk::StatisticsAccumulation accumulation(vector_length - 1, 1);
  sptk::StatisticsAccumulation::Buffer buffer;
  if (!accumulation.IsValid()) {
    std::ostringstream error_message;
    error_message << "Failed to initialize StatisticsAccumulation";
    sptk::PrintErrorMessage("vsum", error_message);
    return 1;
  }

  std::vector<double> data(vector_length);
  std::vector<double> sum(vector_length);
  for (int vector_index(1);
       sptk::ReadStream(false, 0, 0, vector_length, &data, &input_stream, NULL);
       ++vector_index) {
    if (!accumulation.Run(data, &buffer)) {
      std::ostringstream error_message;
      error_message << "Failed to accumulate statistics";
      sptk::PrintErrorMessage("vsum", error_message);
      return 1;
    }

    if (kMagicNumberForEndOfFile != output_interval &&
        0 == vector_index % output_interval) {
      if (!accumulation.GetSum(buffer, &sum)) {
        std::ostringstream error_message;
        error_message << "Failed to accumulate statistics";
        sptk::PrintErrorMessage("vsum", error_message);
        return 1;
      }
      if (!sptk::WriteStream(0, vector_length, sum, &std::cout, NULL)) {
        std::ostringstream error_message;
        error_message << "Failed to write statistics";
        sptk::PrintErrorMessage("vsum", error_message);
        return 1;
      }
      if (!cumulative_mode_flag) {
        accumulation.Clear(&buffer);
      }
    }
  }

  int num_data;
  if (!accumulation.GetNumData(buffer, &num_data)) {
    std::ostringstream error_message;
    error_message << "Failed to accumulate statistics";
    sptk::PrintErrorMessage("vsum", error_message);
    return 1;
  }

  if (kMagicNumberForEndOfFile == output_interval && 0 < num_data) {
    if (!accumulation.GetSum(buffer, &sum)) {
      std::ostringstream error_message;
      error_message << "Failed to compute summation";
      sptk::PrintErrorMessage("vsum", error_message);
      return 1;
    }
    if (!sptk::WriteStream(0, vector_length, sum, &std::cout, NULL)) {
      std::ostringstream error_message;
      error_message << "Failed to write summation";
      sptk::PrintErrorMessage("vsum", error_message);
      return 1;
    }
  }

  return 0;
}